

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktau.hpp
# Opt level: O0

double wdm::impl::ktau(vector<double,_std::allocator<double>_> *x,
                      vector<double,_std::allocator<double>_> *y,
                      vector<double,_std::allocator<double>_> *weights)

{
  size_type sVar1;
  vector<double,_std::allocator<double>_> *in_RDX;
  size_type in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double tau;
  double num_c;
  double num_pairs;
  double *in_stack_00000060;
  vector<double,_std::allocator<double>_> *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  double ties_y;
  double num_d;
  double ties_both;
  double ties_x;
  allocator_type *__a;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff78;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  
  utils::check_sizes(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_RDX);
  utils::sort_all(weights,(vector<double,_std::allocator<double>_> *)ties_x,
                  (vector<double,_std::allocator<double>_> *)ties_both);
  dVar2 = utils::count_tied_pairs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  dVar3 = utils::count_joint_ties
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  utils::merge_sort(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  dVar4 = utils::count_tied_pairs(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  if (sVar1 == 0) {
    std::vector<double,_std::allocator<double>_>::size(in_RDI);
    in_stack_ffffffffffffffa8 = (vector<double,_std::allocator<double>_> *)0x3ff0000000000000;
    __a = (allocator_type *)&stack0xffffffffffffffa7;
    std::allocator<double>::allocator((allocator<double> *)0x1059d8);
    std::vector<double,_std::allocator<double>_>::vector(in_RDX,in_RSI,(value_type *)in_RDI,__a);
    std::vector<double,_std::allocator<double>_>::operator=
              (in_RDI,(vector<double,_std::allocator<double>_> *)__a);
    std::vector<double,_std::allocator<double>_>::~vector(in_RDI);
    std::allocator<double>::~allocator((allocator<double> *)0x105a16);
  }
  dVar5 = utils::perm_sum(in_stack_ffffffffffffffa8,(size_t)in_stack_ffffffffffffffa0);
  dVar3 = (dVar5 - ((dVar2 + 0.0 + dVar4) - dVar3)) - 0.0;
  dVar2 = sqrt((dVar5 - dVar2) * (dVar5 - dVar4));
  return dVar3 / dVar2;
}

Assistant:

inline double ktau(std::vector<double> x,
                   std::vector<double> y,
                   std::vector<double> weights = std::vector<double>())
{
    utils::check_sizes(x, y, weights);

    // 1.1 Sort x, y, and weights in x order; break ties in according to y.
    utils::sort_all(x, y, weights);

    // 1.2 Count pairs of tied x and simultaneous ties in x and y.
    double ties_x = utils::count_tied_pairs(x, weights);
    double ties_both = utils::count_joint_ties(x, y, weights);

    // 2.1 Sort y again and count exchanges (= number of discordant pairs).
    double num_d = 0.0;
    utils::merge_sort(y, weights, num_d);

    // 2.2 Count pairs of tied y.
    double ties_y = utils::count_tied_pairs(y, weights);

    // 3. Calculate Kendall's tau.
    if (weights.size() == 0)
        weights = std::vector<double>(x.size(), 1.0);
    double num_pairs = utils::perm_sum(weights, 2);
    double num_c = num_pairs - (num_d + ties_x + ties_y - ties_both);
    double tau = num_c - num_d;
    tau /= std::sqrt((num_pairs - ties_x) * (num_pairs - ties_y));

    return tau;
}